

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_read_scanline_chunk_info(exr_const_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  exr_result_t eVar6;
  int iVar7;
  uint64_t uVar8;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  _internal_exr_part *in_RDI;
  uint64_t unpacksize;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  uint64_t *ctable;
  exr_attr_box2i_t dw;
  uint64_t dataoff;
  uint64_t chunkmin;
  int64_t fsize;
  int64_t ddata [3];
  int32_t data [3];
  int lpc;
  int rdcnt;
  int cidx;
  int miny;
  exr_result_t rv;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined8 uVar9;
  int local_78;
  int iStack_74;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_70;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_68;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_60;
  long local_58;
  long local_50;
  long local_48;
  uint64_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_part *)0x0) {
    local_4 = 2;
  }
  else if ((char)in_RDI->part_index == '\0') {
    if ((in_ESI < 0) || (in_RDI->num_tile_levels_y <= in_ESI)) {
      local_4 = (*(code *)in_RDI->pixelAspectRatio)(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(in_RDI[1].tile_level_tile_count_y + (long)in_ESI * 2);
      if (in_RCX == (int *)0x0) {
        local_4 = (*(code *)in_RDI->displayWindow)(in_RDI,3);
      }
      else if ((*(int *)(lVar1 + 4) == 1) || (*(int *)(lVar1 + 4) == 3)) {
        local_4 = (*(code *)in_RDI->displayWindow)(in_RDI,0x12);
      }
      else {
        uVar9 = *(undefined8 *)(lVar1 + 0x90);
        uVar2 = *(undefined8 *)(lVar1 + 0x98);
        iVar7 = (int)((ulong)uVar9 >> 0x20);
        iStack_74 = (int)((ulong)uVar2 >> 0x20);
        if ((in_EDX < iVar7) || (iStack_74 < in_EDX)) {
          local_4 = (*(code *)in_RDI->pixelAspectRatio)
                              (in_RDI,3,
                               "Invalid request for scanline %d outside range of data window (%d - %d)"
                               ,in_EDX,iVar7,iStack_74);
        }
        else {
          iVar3 = (int)*(short *)(lVar1 + 0xf0);
          iVar4 = in_EDX - iVar7;
          if (1 < iVar3) {
            iVar4 = iVar4 / iVar3;
          }
          iVar5 = iVar7 + iVar4 * iVar3;
          if ((iVar4 < 0) || (*(int *)(lVar1 + 0xf4) <= iVar4)) {
            local_4 = (*(code *)in_RDI->pixelAspectRatio)
                                (in_RDI,3,
                                 "Invalid request for scanline %d in chunk %d outside chunk count %d"
                                 ,in_EDX,iVar4,*(undefined4 *)(lVar1 + 0xf4));
          }
          else {
            *in_RCX = iVar4;
            *(char *)((long)in_RCX + 0x16) = (char)*(undefined4 *)(lVar1 + 4);
            *(char *)((long)in_RCX + 0x17) = (char)*(undefined4 *)(lVar1 + 0xb0);
            in_RCX[1] = (int)uVar9;
            in_RCX[2] = iVar5;
            local_78 = (int)uVar2;
            in_RCX[4] = (local_78 - (int)uVar9) + 1;
            in_RCX[3] = iVar3;
            if (iVar5 < iVar7) {
              in_RCX[2] = iVar7;
              in_RCX[3] = in_RCX[3] - (iVar7 - iVar5);
            }
            else if (iStack_74 < iVar5 + iVar3) {
              in_RCX[3] = (iStack_74 - iVar5) + 1;
            }
            *(undefined1 *)(in_RCX + 5) = 0;
            *(undefined1 *)((long)in_RCX + 0x15) = 0;
            local_4 = extract_chunk_table((_internal_exr_context *)
                                          CONCAT44(in_stack_ffffffffffffffdc,iVar5),
                                          (_internal_exr_part *)
                                          CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                          (uint64_t **)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc0);
            iVar7 = (int)in_stack_ffffffffffffffc0;
            if (local_4 == 0) {
              local_60 = *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)
                          (in_RDI->data_window).max.field_0.arr;
              local_70 = *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)
                          ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)
                          (CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78) +
                          (long)iVar4 * 8))->arr;
              if (((ulong)local_70 < (ulong)local_68) ||
                 ((0 < (long)local_60 && ((ulong)local_60 < (ulong)local_70)))) {
                local_4 = (*(code *)in_RDI->pixelAspectRatio)
                                    (in_RDI,0x16,
                                     "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %lu"
                                     ,in_EDX,iVar4,local_70);
              }
              else {
                iVar3 = 1;
                if (*(byte *)((long)&in_RDI->storage_mode + 1) != 0) {
                  iVar3 = 2;
                }
                if (*(int *)(lVar1 + 4) != 2) {
                  iVar3 = iVar3 + 1;
                }
                local_4 = (*(code *)in_RDI->compression)
                                    (in_RDI,&stack0xffffffffffffffc0,(long)iVar3 << 2,&local_70,0,0)
                ;
                if (local_4 == 0) {
                  priv_to_native32(&stack0xffffffffffffffc0,iVar3);
                  iVar3 = 0;
                  if (*(byte *)((long)&in_RDI->storage_mode + 1) != 0) {
                    if (iVar7 != in_ESI) {
                      eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                        (in_RDI,0x16,
                                         "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d"
                                         ,in_EDX,iVar4,iVar7,in_ESI);
                      return eVar6;
                    }
                    iVar3 = 1;
                  }
                  if (iVar5 == *(int *)(&stack0xffffffffffffffc0 + (long)iVar3 * 4)) {
                    if (*(int *)(lVar1 + 4) == 2) {
                      iVar7 = (*(code *)in_RDI->compression)(in_RDI,&local_58,0x18,&local_70,0,0);
                      if (iVar7 != 0) {
                        return iVar7;
                      }
                      priv_to_native64(&local_58,3);
                      if (local_58 < 0) {
                        eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %ld"
                                           ,in_EDX,iVar4,local_58);
                        return eVar6;
                      }
                      if ((local_50 < 0) || (0x7fffffff < local_50)) {
                        eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %ld"
                                           ,in_EDX,iVar4,local_50);
                        return eVar6;
                      }
                      if ((local_48 < 0) || (0x7fffffff < local_48)) {
                        eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                          (in_RDI,0x16,
                                           "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %ld"
                                           ,in_EDX,iVar4,local_48);
                        return eVar6;
                      }
                      *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)
                       ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(in_RCX + 0xc))->arr =
                           local_70;
                      *(long *)(in_RCX + 0xe) = local_58;
                      *(long *)(in_RCX + 6) = (long)local_70 + local_58;
                      *(long *)(in_RCX + 8) = local_50;
                      *(long *)(in_RCX + 10) = local_48;
                      if ((0 < (long)local_60) &&
                         (((ulong)local_60 <
                           (ulong)(*(long *)(in_RCX + 0xc) + *(long *)(in_RCX + 0xe)) ||
                          ((ulong)local_60 < (ulong)(*(long *)(in_RCX + 6) + *(long *)(in_RCX + 8)))
                          ))) {
                        eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                          (in_RDI,0x16,
                                           "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %ld + data size %ld larger than file %ld"
                                           ,in_EDX,iVar4,local_58,local_50,local_60);
                        return eVar6;
                      }
                    }
                    else {
                      uVar8 = compute_chunk_unpack_size
                                        ((int)((ulong)uVar9 >> 0x20),(int)uVar9,
                                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_RDI)
                      ;
                      iVar3 = iVar3 + 1;
                      if ((*(int *)(&stack0xffffffffffffffc0 + (long)iVar3 * 4) < 0) ||
                         (*(ulong *)(lVar1 + 0xe8) <
                          (ulong)(long)*(int *)(&stack0xffffffffffffffc0 + (long)iVar3 * 4))) {
                        eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %lu, must be between 0 and %lu"
                                           ,in_EDX,iVar4,
                                           (long)*(int *)(&stack0xffffffffffffffc0 + (long)iVar3 * 4
                                                         ),*(undefined8 *)(lVar1 + 0xe8));
                        return eVar6;
                      }
                      *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(in_RCX + 6) = local_70;
                      *(long *)(in_RCX + 8) =
                           (long)*(int *)(&stack0xffffffffffffffc0 + (long)iVar3 * 4);
                      *(uint64_t *)(in_RCX + 10) = uVar8;
                      in_RCX[0xc] = 0;
                      in_RCX[0xd] = 0;
                      in_RCX[0xe] = 0;
                      in_RCX[0xf] = 0;
                      if ((0 < (long)local_60) &&
                         ((ulong)local_60 < (ulong)(*(long *)(in_RCX + 6) + *(long *)(in_RCX + 8))))
                      {
                        eVar6 = (*(code *)in_RDI->pixelAspectRatio)
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %lu, file offset %lu, size %ld"
                                           ,in_EDX,iVar4,*(undefined8 *)(in_RCX + 8),
                                           *(undefined8 *)(in_RCX + 6),local_60);
                        return eVar6;
                      }
                    }
                    if ((*(long *)(in_RCX + 8) == 0) && (*(long *)(in_RCX + 10) != 0)) {
                      local_4 = (*(code *)in_RDI->lineOrder)(in_RDI,3,"Invalid packed size of 0");
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                  else {
                    local_4 = (*(code *)in_RDI->pixelAspectRatio)
                                        (in_RDI,0x16,
                                         "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d"
                                         ,in_EDX,iVar4,
                                         *(undefined4 *)(&stack0xffffffffffffffc0 + (long)iVar3 * 4)
                                         ,iVar5);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    local_4 = (*(code *)in_RDI->displayWindow)(in_RDI,7);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_read_scanline_chunk_info (
    exr_const_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_result_t     rv;
    int              miny, cidx, rdcnt, lpc;
    int32_t          data[3];
    int64_t          ddata[3];
    int64_t          fsize;
    uint64_t         chunkmin, dataoff;
    exr_attr_box2i_t dw;
    uint64_t*        ctable;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!cinfo) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return pctxt->standard_error (pctxt, EXR_ERR_SCAN_TILE_MIXEDAPI);
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y);
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    // do we need to invert this when reading decreasing y? it appears not
    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = (dw.min.y + cidx * lpc);

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count);
    }

    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    /* need to read from the file to get the packed chunk size */
    rv = extract_chunk_table (pctxt, part, &ctable, &chunkmin);
    if (rv != EXR_ERR_SUCCESS) return rv;

    fsize = pctxt->file_size;

    dataoff = ctable[cidx];
    if (dataoff < chunkmin || (fsize > 0 && dataoff > (uint64_t) fsize))
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %" PRIu64,
            y,
            cidx,
            dataoff);
    }

    /* TODO: Look at collapsing this into extract_chunk_leader, only
     * issue is more concrete error messages */
    /* multi part files have the part for validation */
    rdcnt = (pctxt->is_multipart) ? 2 : 1;
    /* deep has 64-bit data, so be variable about what we read */
    if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++rdcnt;

    rv = pctxt->do_read (
        pctxt,
        data,
        (size_t) (rdcnt) * sizeof (int32_t),
        &dataoff,
        NULL,
        EXR_MUST_READ_ALL);

    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, rdcnt);

    rdcnt = 0;
    if (pctxt->is_multipart)
    {
        if (data[rdcnt] != part_index)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d",
                y,
                cidx,
                data[rdcnt],
                part_index);
        }
        ++rdcnt;
    }
    if (miny != data[rdcnt])
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d",
            y,
            cidx,
            data[rdcnt],
            miny);
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        rv = pctxt->do_read (
            pctxt,
            ddata,
            3 * sizeof (int64_t),
            &dataoff,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
        priv_to_native64 (ddata, 3);

        if (ddata[0] < 0)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %" PRId64,
                y,
                cidx,
                ddata[0]);
        }
        if (ddata[1] < 0 || ddata[1] > (int64_t) INT_MAX)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %" PRId64,
                y,
                cidx,
                ddata[1]);
        }
        if (ddata[2] < 0 || ddata[2] > (int64_t) INT_MAX)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %" PRId64,
                y,
                cidx,
                ddata[2]);
        }

        cinfo->sample_count_data_offset = dataoff;
        cinfo->sample_count_table_size  = (uint64_t) ddata[0];
        cinfo->data_offset              = dataoff + (uint64_t) ddata[0];
        cinfo->packed_size              = (uint64_t) ddata[1];
        cinfo->unpacked_size            = (uint64_t) ddata[2];

        if (fsize > 0 &&
            ((cinfo->sample_count_data_offset +
              cinfo->sample_count_table_size) > ((uint64_t) fsize) ||
             (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize)))
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %" PRId64
                " + data size %" PRId64 " larger than file %" PRId64,
                y,
                cidx,
                ddata[0],
                ddata[1],
                fsize);
        }
    }
    else
    {
        uint64_t unpacksize = compute_chunk_unpack_size (
            y, cinfo->width, cinfo->height, lpc, part);

        ++rdcnt;
        if (data[rdcnt] < 0 ||
            (uint64_t) data[rdcnt] > part->unpacked_size_per_chunk)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %" PRIu64
                ", must be between 0 and %" PRIu64,
                y,
                cidx,
                (uint64_t) data[rdcnt],
                part->unpacked_size_per_chunk);
        }

        cinfo->data_offset              = dataoff;
        cinfo->packed_size              = (uint64_t) data[rdcnt];
        cinfo->unpacked_size            = unpacksize;
        cinfo->sample_count_data_offset = 0;
        cinfo->sample_count_table_size  = 0;

        if (fsize > 0 &&
            (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize))
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %" PRIu64
                ", file offset %" PRIu64 ", size %" PRId64,
                y,
                cidx,
                cinfo->packed_size,
                cinfo->data_offset,
                fsize);
        }
    }

    if (cinfo->packed_size == 0 && cinfo->unpacked_size > 0)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid packed size of 0");
    return EXR_ERR_SUCCESS;
}